

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# llama-model.cpp
# Opt level: O2

void __thiscall llama_model::load_arch(llama_model *this,llama_model_loader *ml)

{
  llm_arch lVar1;
  runtime_error *this_00;
  string sStack_78;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_58;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_38;
  
  lVar1 = llama_model_loader::get_arch(ml);
  this->arch = lVar1;
  if (lVar1 != LLM_ARCH_UNKNOWN) {
    return;
  }
  this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
  llama_model_loader::get_arch_name_abi_cxx11_(&sStack_78,ml);
  std::operator+(&local_58,"unknown model architecture: \'",&sStack_78);
  std::operator+(&local_38,&local_58,"\'");
  std::runtime_error::runtime_error(this_00,(string *)&local_38);
  __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

void llama_model::load_arch(llama_model_loader & ml) {
    arch = ml.get_arch();
    if (arch == LLM_ARCH_UNKNOWN) {
        throw std::runtime_error("unknown model architecture: '" + ml.get_arch_name() + "'");
    }
}